

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::DescriptorBuilder::~DescriptorBuilder(DescriptorBuilder *this)

{
  pointer this_00;
  long lVar1;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX;
  
  std::__cxx11::string::~string((string *)&this->possible_undeclared_dependency_name_);
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree(&(this->dependencies_)._M_t);
  std::__cxx11::string::~string((string *)&this->filename_);
  std::
  _Destroy<google::protobuf::(anonymous_namespace)::OptionsToInterpret*,google::protobuf::(anonymous_namespace)::OptionsToInterpret>
            ((this->options_to_interpret_).
             super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->options_to_interpret_).
             super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ._M_impl.super__Vector_impl_data._M_finish,extraout_RDX);
  this_00 = (this->options_to_interpret_).
            super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
  std::
  _Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ::_M_deallocate((_Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   *)this_00,(pointer)(lVar1 / 0x50),lVar1 % 0x50);
  return;
}

Assistant:

DescriptorBuilder::~DescriptorBuilder() {}